

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O1

void test_write_format_zip_large(void)

{
  fileblock *pfVar1;
  bool bVar2;
  int iVar3;
  wchar_t wVar4;
  fileblocks *pfVar5;
  archive *paVar6;
  archive_entry *paVar7;
  ssize_t sVar8;
  void *pvVar9;
  size_t __n;
  fileblock *b;
  size_t s;
  ulong uVar10;
  size_t s_00;
  size_t sVar11;
  longlong v1;
  char *p;
  fileblocks *private;
  char namebuff [64];
  void *local_90;
  fileblocks *local_88;
  ulong local_80;
  char local_78 [72];
  
  pfVar5 = (fileblocks *)calloc(1,0x38);
  nullsize = 1;
  nulldata = malloc(0x100000);
  memset(nulldata,0xaa,0x100000);
  paVar6 = archive_write_new();
  archive_write_set_format_zip(paVar6);
  iVar3 = archive_write_set_options(paVar6,"zip:compression=store");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ŏ',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"zip:compression=store\")",paVar6);
  iVar3 = archive_write_set_options(paVar6,"zip:fakecrc32");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ő',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"zip:fakecrc32\")",paVar6);
  iVar3 = archive_write_set_bytes_per_block(paVar6,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Œ',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_bytes_per_block(a, 0)",
                      paVar6);
  local_88 = pfVar5;
  iVar3 = archive_write_open(paVar6,pfVar5,(undefined1 *)0x0,memory_write,(undefined1 *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ŕ',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open(a, fileblocks, NULL, memory_write, NULL)",paVar6);
  uVar10 = 0;
  do {
    paVar7 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                     ,L'Ś',(uint)(paVar7 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    sprintf(local_78,"file_%d",uVar10 & 0xffffffff);
    archive_entry_copy_pathname(paVar7,local_78);
    archive_entry_set_mode(paVar7,0x81ed);
    s_00 = test_sizes[uVar10];
    local_80 = uVar10;
    archive_entry_set_size(paVar7,s_00);
    iVar3 = archive_write_header(paVar6,paVar7);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                        ,L'Ţ',0,"ARCHIVE_OK",(long)iVar3,"archive_write_header(a, ae)",paVar6);
    archive_entry_free(paVar7);
    do {
      s = 0x100000;
      if ((long)s_00 < 0x100000) {
        s = s_00;
      }
      sVar8 = archive_write_data(paVar6,nulldata,s);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                          ,L'ŭ',s,"(int)writesize",(long)(int)sVar8,
                          "(int)archive_write_data(a, nulldata, writesize)",paVar6);
      sVar11 = s_00 - s;
      bVar2 = (long)s <= (long)s_00;
      s_00 = sVar11;
    } while (sVar11 != 0 && bVar2);
    uVar10 = local_80 + 1;
  } while (uVar10 != 0x10);
  paVar7 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'Ų',(uint)(paVar7 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar7,"lastfile");
  archive_entry_set_mode(paVar7,0x81ed);
  iVar3 = archive_write_header(paVar6,paVar7);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                   ,L'ŵ',(uint)(iVar3 == 0),"0 == archive_write_header(a, ae)",paVar6);
  archive_entry_free(paVar7);
  iVar3 = archive_write_close(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ź',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",paVar6);
  iVar3 = archive_write_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ź',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  paVar6 = archive_read_new();
  wVar4 = archive_read_support_format_zip_seekable(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ɓ',0,"ARCHIVE_OK",(long)wVar4,
                      "archive_read_support_format_zip_seekable(a)",paVar6);
  pfVar5 = local_88;
  verify_large_zip(paVar6,local_88);
  iVar3 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƃ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  paVar6 = archive_read_new();
  wVar4 = archive_read_support_format_zip_streamable(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ɗ',0,"ARCHIVE_OK",(long)wVar4,
                      "archive_read_support_format_zip_streamable(a)",paVar6);
  verify_large_zip(paVar6,pfVar5);
  iVar3 = archive_read_free(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƌ',0,"ARCHIVE_OK",(long)iVar3,"archive_read_free(a)",(void *)0x0);
  paVar6 = (archive *)0x200;
  pvVar9 = malloc(0x200);
  pfVar1 = pfVar5->first;
  pfVar5->current = pfVar1;
  pfVar5->fileposition = 0;
  if (pfVar1 != (fileblock *)0x0) {
    pfVar5->buff = pfVar1->buff;
    pfVar5->gap_remaining = pfVar1->gap_size;
  }
  memory_read_seek(paVar6,pfVar5,-0x200,2);
  __n = memory_read(paVar6,pfVar5,&local_90);
  if (__n == 0) {
    v1 = 0;
  }
  else {
    v1 = 0;
    do {
      paVar6 = (archive *)((long)pvVar9 + v1);
      memcpy(paVar6,local_90,__n);
      v1 = v1 + __n;
      __n = memory_read(paVar6,pfVar5,&local_90);
    } while (__n != 0);
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƛ',v1,"buffsize",0x200,"FINAL_SIZE",(void *)0x0);
  local_90 = (void *)((long)pvVar9 + v1);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ơ',(void *)((long)pvVar9 + v1 + -0x2a),"p - 42","PK\x06\a",
                      "\"PK\\006\\007\\0\\0\\0\\0\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƣ',(void *)((long)pvVar9 + v1 + -0x1a),"p - 26","\x01",
                      "\"\\001\\0\\0\\0\"",4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ʀ',(void *)((long)pvVar9 + v1 + -0x16),"p - 22","PK\x05\x06",
                      "\"PK\\005\\006\\0\\0\\0\\0\"",8,"8",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƨ',(void *)((long)pvVar9 + v1 + -0xe),"p - 14","\x11",
                      "\"\\021\\0\\021\\0\"",4,"4",(void *)0x0);
  pfVar5 = local_88;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'ƭ',(void *)((long)pvVar9 + v1 + -6),"p - 6",anon_var_dwarf_fa877,
                      "\"\\xff\\xff\\xff\\xff\"",4,"4",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_zip_large.c"
                      ,L'Ư',(void *)((long)pvVar9 + v1 + -2),"p - 2","","\"\\0\\0\"",2,"2",
                      (void *)0x0);
  while (pfVar1 = pfVar5->first, pfVar1 != (fileblock *)0x0) {
    pfVar5->first = pfVar1->next;
    free(pfVar1->buff);
    free(pfVar1);
  }
  free(pfVar5);
  free(nulldata);
  return;
}

Assistant:

static struct fileblocks *
fileblocks_new(void)
{
	struct fileblocks *fileblocks;

	fileblocks = calloc(1, sizeof(struct fileblocks));
	return fileblocks;
}